

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode cr_eob_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                    _Bool *peos)

{
  _Bool _Var1;
  CURLcode CVar2;
  void *pvVar3;
  bufq *q;
  size_t len;
  char *local_80;
  char *eob;
  _Bool eos;
  size_t n;
  size_t start;
  size_t i;
  size_t nread;
  void *pvStack_48;
  CURLcode result;
  cr_eob_ctx *ctx;
  _Bool *peos_local;
  size_t *pnread_local;
  size_t blen_local;
  char *buf_local;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  pvStack_48 = reader->ctx;
  nread._4_4_ = CURLE_OK;
  ctx = (cr_eob_ctx *)peos;
  peos_local = (_Bool *)pnread;
  pnread_local = (size_t *)blen;
  blen_local = (size_t)buf;
  buf_local = (char *)reader;
  reader_local = (Curl_creader *)data;
  if (((*(byte *)((long)pvStack_48 + 0x70) & 1) == 0) &&
     (_Var1 = Curl_bufq_is_empty((bufq *)((long)pvStack_48 + 0x20)), _Var1)) {
    nread._4_4_ = Curl_creader_read((Curl_easy *)reader_local,*(Curl_creader **)(buf_local + 8),
                                    (char *)blen_local,(size_t)pnread_local,&i,
                                    (_Bool *)((long)&eob + 7));
    if (nread._4_4_ != CURLE_OK) {
      return nread._4_4_;
    }
    *(byte *)((long)pvStack_48 + 0x70) = *(byte *)((long)pvStack_48 + 0x70) & 0xfe | eob._7_1_ & 1;
    if (i != 0) {
      if ((*(long *)((long)pvStack_48 + 0x60) == 0) &&
         (pvVar3 = memchr((void *)blen_local,0xd,i), pvVar3 == (void *)0x0)) {
        *(size_t *)peos_local = i;
        *(undefined1 *)&(ctx->super).crt = 0;
        return CURLE_OK;
      }
      n = 0;
      for (start = 0; start < i; start = start + 1) {
        if (2 < *(ulong *)((long)pvStack_48 + 0x60)) {
          nread._4_4_ = Curl_bufq_cwrite((bufq *)((long)pvStack_48 + 0x20),(char *)(blen_local + n),
                                         start - n,(size_t *)&stack0xffffffffffffff90);
          if (nread._4_4_ != CURLE_OK) {
            return nread._4_4_;
          }
          CVar2 = Curl_bufq_cwrite((bufq *)((long)pvStack_48 + 0x20),".",1,
                                   (size_t *)&stack0xffffffffffffff90);
          if (CVar2 != CURLE_OK) {
            return CVar2;
          }
          *(undefined8 *)((long)pvStack_48 + 0x60) = 0;
          n = start;
          nread._4_4_ = CURLE_OK;
          if (0 < *(long *)&reader_local[0x8e].phase) {
            *(long *)&reader_local[0x8e].phase = *(long *)&reader_local[0x8e].phase + 1;
          }
        }
        if (*(char *)(blen_local + start) != ".\r\n.\r\n"[*(long *)((long)pvStack_48 + 0x60) + 1]) {
          *(undefined8 *)((long)pvStack_48 + 0x60) = 0;
        }
        if (*(char *)(blen_local + start) == ".\r\n.\r\n"[*(long *)((long)pvStack_48 + 0x60) + 1]) {
          *(long *)((long)pvStack_48 + 0x60) = *(long *)((long)pvStack_48 + 0x60) + 1;
        }
      }
      if ((n < i) &&
         (nread._4_4_ = Curl_bufq_cwrite((bufq *)((long)pvStack_48 + 0x20),(char *)(blen_local + n),
                                         i - n,(size_t *)&stack0xffffffffffffff90),
         nread._4_4_ != CURLE_OK)) {
        return nread._4_4_;
      }
    }
    if ((*(byte *)((long)pvStack_48 + 0x70) & 1) != 0) {
      local_80 = "\r\n.\r\n";
      if (*(long *)((long)pvStack_48 + 0x60) == 2) {
        local_80 = ".\r\n";
      }
      else if (*(long *)((long)pvStack_48 + 0x60) == 3) {
        local_80 = ".\r\n.\r\n";
      }
      q = (bufq *)((long)pvStack_48 + 0x20);
      len = strlen(local_80);
      nread._4_4_ = Curl_bufq_cwrite(q,local_80,len,(size_t *)&stack0xffffffffffffff90);
      if (nread._4_4_ != CURLE_OK) {
        return nread._4_4_;
      }
    }
  }
  *(undefined1 *)&(ctx->super).crt = 0;
  _Var1 = Curl_bufq_is_empty((bufq *)((long)pvStack_48 + 0x20));
  if (_Var1) {
    peos_local[0] = false;
    peos_local[1] = false;
    peos_local[2] = false;
    peos_local[3] = false;
    peos_local[4] = false;
    peos_local[5] = false;
    peos_local[6] = false;
    peos_local[7] = false;
  }
  else {
    nread._4_4_ = Curl_bufq_cread((bufq *)((long)pvStack_48 + 0x20),(char *)blen_local,
                                  (size_t)pnread_local,(size_t *)peos_local);
  }
  if (((*(byte *)((long)pvStack_48 + 0x70) & 1) != 0) &&
     (_Var1 = Curl_bufq_is_empty((bufq *)((long)pvStack_48 + 0x20)), _Var1)) {
    *(byte *)((long)pvStack_48 + 0x70) = *(byte *)((long)pvStack_48 + 0x70) & 0xfd | 2;
  }
  *(bool *)&(ctx->super).crt = (*(byte *)((long)pvStack_48 + 0x70) >> 1 & 1) != 0;
  return nread._4_4_;
}

Assistant:

static CURLcode cr_eob_read(struct Curl_easy *data,
                            struct Curl_creader *reader,
                            char *buf, size_t blen,
                            size_t *pnread, bool *peos)
{
  struct cr_eob_ctx *ctx = reader->ctx;
  CURLcode result = CURLE_OK;
  size_t nread, i, start, n;
  bool eos;

  if(!ctx->read_eos && Curl_bufq_is_empty(&ctx->buf)) {
    /* Get more and convert it when needed */
    result = Curl_creader_read(data, reader->next, buf, blen, &nread, &eos);
    if(result)
      return result;

    ctx->read_eos = eos;
    if(nread) {
      if(!ctx->n_eob && !memchr(buf, SMTP_EOB[0], nread)) {
        /* not in the middle of a match, no EOB start found, just pass */
        *pnread = nread;
        *peos = FALSE;
        return CURLE_OK;
      }
      /* scan for EOB (continuation) and convert */
      for(i = start = 0; i < nread; ++i) {
        if(ctx->n_eob >= SMTP_EOB_FIND_LEN) {
          /* matched the EOB prefix and seeing additional char, add '.' */
          result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
          if(result)
            return result;
          result = Curl_bufq_cwrite(&ctx->buf, ".", 1, &n);
          if(result)
            return result;
          ctx->n_eob = 0;
          start = i;
          if(data->state.infilesize > 0)
            data->state.infilesize++;
        }

        if(buf[i] != SMTP_EOB[ctx->n_eob])
          ctx->n_eob = 0;

        if(buf[i] == SMTP_EOB[ctx->n_eob]) {
          /* matching another char of the EOB */
          ++ctx->n_eob;
        }
      }

      /* add any remainder to buf */
      if(start < nread) {
        result = Curl_bufq_cwrite(&ctx->buf, buf + start, nread - start, &n);
        if(result)
          return result;
      }
    }

    if(ctx->read_eos) {
      /* if we last matched a CRLF or if the data was empty, add ".\r\n"
       * to end the body. If we sent something and it did not end with "\r\n",
       * add "\r\n.\r\n" to end the body */
      const char *eob = SMTP_EOB;
      switch(ctx->n_eob) {
        case 2:
          /* seen a CRLF at the end, just add the remainder */
          eob = &SMTP_EOB[2];
          break;
        case 3:
          /* ended with '\r\n.', we should escpe the last '.' */
          eob = "." SMTP_EOB;
          break;
        default:
          break;
      }
      result = Curl_bufq_cwrite(&ctx->buf, eob, strlen(eob), &n);
      if(result)
        return result;
    }
  }

  *peos = FALSE;
  if(!Curl_bufq_is_empty(&ctx->buf)) {
    result = Curl_bufq_cread(&ctx->buf, buf, blen, pnread);
  }
  else
    *pnread = 0;

  if(ctx->read_eos && Curl_bufq_is_empty(&ctx->buf)) {
    /* no more data, read all, done. */
    ctx->eos = TRUE;
  }
  *peos = ctx->eos;
  DEBUGF(infof(data, "cr_eob_read(%zu) -> %d, %zd, %d",
         blen, result, *pnread, *peos));
  return result;
}